

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

pair<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>,_bool>
* __thiscall
pstore::json::details::object_matcher<json_out_callbacks>::consume
          (pair<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>,_bool>
           *__return_storage_ptr__,object_matcher<json_out_callbacks> *this,
          parser<json_out_callbacks> *parser,maybe<char,_void> *ch)

{
  maybe<char,_void> *pmVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  error_code *this_00;
  char *pcVar5;
  json_out_callbacks *this_01;
  error_code eVar6;
  bool local_131;
  void *local_130;
  error_code local_128;
  bool local_111;
  matcher<json_out_callbacks> local_110;
  bool local_f9;
  matcher<json_out_callbacks> local_f8;
  bool local_e1;
  matcher<json_out_callbacks> local_e0;
  error_code local_d0;
  bool local_b9;
  matcher<json_out_callbacks> local_b8;
  bool local_a1;
  matcher<json_out_callbacks> local_a0 [2];
  bool local_79;
  matcher<json_out_callbacks> local_78;
  error_code local_68;
  char local_52;
  bool local_51;
  char c;
  void *pvStack_50;
  error_code local_48;
  bool local_31;
  void *local_30;
  maybe<char,_void> *local_28;
  maybe<char,_void> *ch_local;
  parser<json_out_callbacks> *parser_local;
  object_matcher<json_out_callbacks> *this_local;
  
  local_28 = ch;
  ch_local = (maybe<char,_void> *)parser;
  parser_local = (parser<json_out_callbacks> *)this;
  this_local = (object_matcher<json_out_callbacks> *)__return_storage_ptr__;
  iVar3 = matcher<json_out_callbacks>::get_state(&this->super_matcher<json_out_callbacks>);
  if (iVar3 == 1) {
    this_00 = parser<json_out_callbacks>::last_error((parser<json_out_callbacks> *)ch_local);
    bVar2 = std::error_code::operator_cast_to_bool(this_00);
    if (bVar2) {
      local_30 = (void *)0x0;
      local_31 = true;
      std::
      pair<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>,_bool>
      ::pair<std::nullptr_t,_bool,_true>(__return_storage_ptr__,&local_30,&local_31);
      return __return_storage_ptr__;
    }
    assert_failed("parser.last_error ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/json/json.hpp"
                  ,0x4f6);
  }
  bVar2 = maybe::operator_cast_to_bool((maybe *)ch);
  pmVar1 = ch_local;
  if (!bVar2) {
    std::error_code::error_code<pstore::json::error_code,void>(&local_48,expected_object_member);
    matcher<json_out_callbacks>::set_error
              (&this->super_matcher<json_out_callbacks>,(parser<json_out_callbacks> *)pmVar1,
               &local_48);
    pvStack_50 = (void *)0x0;
    local_51 = true;
    std::
    pair<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>,_bool>
    ::pair<std::nullptr_t,_bool,_true>(__return_storage_ptr__,&stack0xffffffffffffffb0,&local_51);
    return __return_storage_ptr__;
  }
  pcVar5 = maybe<char,_void>::operator*(ch);
  local_52 = *pcVar5;
  iVar3 = matcher<json_out_callbacks>::get_state(&this->super_matcher<json_out_callbacks>);
  switch(iVar3) {
  case 1:
    assert_failed("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/json/json.hpp"
                  ,0x536);
  case 2:
    if (local_52 != '{') {
      assert_failed("c == \'{\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/json/json.hpp"
                    ,0x500);
    }
    matcher<json_out_callbacks>::set_state(&this->super_matcher<json_out_callbacks>,3);
    pmVar1 = ch_local;
    this_01 = parser<json_out_callbacks>::callbacks((parser<json_out_callbacks> *)ch_local);
    eVar6 = json_out_callbacks::begin_object(this_01);
    local_68._M_cat = eVar6._M_cat;
    local_68._M_value = eVar6._M_value;
    bVar2 = matcher<json_out_callbacks>::set_error
                      (&this->super_matcher<json_out_callbacks>,(parser<json_out_callbacks> *)pmVar1
                       ,&local_68);
    if (!bVar2) {
      matcher<json_out_callbacks>::make_whitespace_matcher
                (&local_78,(parser<json_out_callbacks> *)this);
      local_79 = true;
      std::
      pair<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>,_bool>
      ::
      pair<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>,_bool,_true>
                (__return_storage_ptr__,
                 (unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
                  *)&local_78,&local_79);
      std::
      unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
      ::~unique_ptr((unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
                     *)&local_78);
      return __return_storage_ptr__;
    }
    break;
  case 3:
    if (local_52 != '}') goto switchD_0015dc79_caseD_4;
    end_object(this,(parser<json_out_callbacks> *)ch_local);
    break;
  case 4:
switchD_0015dc79_caseD_4:
    matcher<json_out_callbacks>::set_state(&this->super_matcher<json_out_callbacks>,5);
    matcher<json_out_callbacks>::make_root_matcher
              (local_a0,(parser<json_out_callbacks> *)this,SUB81(ch_local,0));
    local_a1 = false;
    std::
    pair<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>,_bool>
    ::
    pair<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>,_bool,_true>
              (__return_storage_ptr__,
               (unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
                *)local_a0,&local_a1);
    std::
    unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
    ::~unique_ptr((unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
                   *)local_a0);
    return __return_storage_ptr__;
  case 5:
    uVar4 = isspace((int)local_52);
    pmVar1 = ch_local;
    if ((uVar4 & 1) != 0) {
      matcher<json_out_callbacks>::make_whitespace_matcher
                (&local_b8,(parser<json_out_callbacks> *)this);
      local_b9 = false;
      std::
      pair<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>,_bool>
      ::
      pair<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>,_bool,_true>
                (__return_storage_ptr__,
                 (unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
                  *)&local_b8,&local_b9);
      std::
      unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
      ::~unique_ptr((unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
                     *)&local_b8);
      return __return_storage_ptr__;
    }
    if (local_52 == ':') {
      matcher<json_out_callbacks>::set_state(&this->super_matcher<json_out_callbacks>,6);
    }
    else {
      std::error_code::error_code<pstore::json::error_code,void>(&local_d0,expected_colon);
      matcher<json_out_callbacks>::set_error
                (&this->super_matcher<json_out_callbacks>,(parser<json_out_callbacks> *)pmVar1,
                 &local_d0);
    }
    break;
  case 6:
    matcher<json_out_callbacks>::set_state(&this->super_matcher<json_out_callbacks>,7);
    matcher<json_out_callbacks>::make_root_matcher
              (&local_e0,(parser<json_out_callbacks> *)this,SUB81(ch_local,0));
    local_e1 = false;
    std::
    pair<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>,_bool>
    ::
    pair<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>,_bool,_true>
              (__return_storage_ptr__,
               (unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
                *)&local_e0,&local_e1);
    std::
    unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
    ::~unique_ptr((unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
                   *)&local_e0);
    return __return_storage_ptr__;
  case 7:
    uVar4 = isspace((int)local_52);
    pmVar1 = ch_local;
    if ((uVar4 & 1) != 0) {
      matcher<json_out_callbacks>::make_whitespace_matcher
                (&local_f8,(parser<json_out_callbacks> *)this);
      local_f9 = false;
      std::
      pair<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>,_bool>
      ::
      pair<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>,_bool,_true>
                (__return_storage_ptr__,
                 (unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
                  *)&local_f8,&local_f9);
      std::
      unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
      ::~unique_ptr((unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
                     *)&local_f8);
      return __return_storage_ptr__;
    }
    if (local_52 == ',') {
      bVar2 = parser<json_out_callbacks>::extension_enabled
                        ((parser<json_out_callbacks> *)ch_local,object_trailing_comma);
      matcher<json_out_callbacks>::set_state
                (&this->super_matcher<json_out_callbacks>,4 - (uint)bVar2);
      matcher<json_out_callbacks>::make_whitespace_matcher
                (&local_110,(parser<json_out_callbacks> *)this);
      local_111 = true;
      std::
      pair<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>,_bool>
      ::
      pair<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>,_bool,_true>
                (__return_storage_ptr__,
                 (unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
                  *)&local_110,&local_111);
      std::
      unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
      ::~unique_ptr((unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
                     *)&local_110);
      return __return_storage_ptr__;
    }
    if (local_52 == '}') {
      end_object(this,(parser<json_out_callbacks> *)ch_local);
    }
    else {
      std::error_code::error_code<pstore::json::error_code,void>(&local_128,expected_object_member);
      matcher<json_out_callbacks>::set_error
                (&this->super_matcher<json_out_callbacks>,(parser<json_out_callbacks> *)pmVar1,
                 &local_128);
    }
  }
  local_130 = (void *)0x0;
  local_131 = true;
  std::
  pair<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>,_bool>
  ::pair<std::nullptr_t,_bool,_true>(__return_storage_ptr__,&local_130,&local_131);
  return __return_storage_ptr__;
}

Assistant:

std::pair<typename matcher<Callbacks>::pointer, bool>
            object_matcher<Callbacks>::consume (parser<Callbacks> & parser, maybe<char> ch) {
                if (this->get_state () == done_state) {
                    PSTORE_ASSERT (parser.last_error ());
                    return {nullptr, true};
                }
                if (!ch) {
                    this->set_error (parser, error_code::expected_object_member);
                    return {nullptr, true};
                }
                char const c = *ch;
                switch (this->get_state ()) {
                case start_state:
                    PSTORE_ASSERT (c == '{');
                    this->set_state (first_key_state);
                    if (this->set_error (parser, parser.callbacks ().begin_object ())) {
                        break;
                    }
                    return {this->make_whitespace_matcher (parser), true};
                case first_key_state:
                    // We allow either a closing brace (to end the object) or a property name.
                    if (c == '}') {
                        this->end_object (parser);
                        break;
                    }
                    PSTORE_FALLTHROUGH;
                case key_state:
                    // Match a property name then expect a colon.
                    this->set_state (colon_state);
                    return {this->make_root_matcher (parser, true /*object key?*/), false};
                case colon_state:
                    if (isspace (c)) {
                        // just consume whitespace before the colon.
                        return {this->make_whitespace_matcher (parser), false};
                    }
                    if (c == ':') {
                        this->set_state (value_state);
                    } else {
                        this->set_error (parser, error_code::expected_colon);
                    }
                    break;
                case value_state:
                    this->set_state (comma_state);
                    return {this->make_root_matcher (parser), false};
                case comma_state:
                    if (isspace (c)) {
                        // just consume whitespace before the comma.
                        return {this->make_whitespace_matcher (parser), false};
                    }
                    if (c == ',') {
                        // Strictly conforming JSON requires a property name following a comma but
                        // we have an extension to allow an trailing comma which may be followed by
                        // the object's closing brace.
                        this->set_state (
                            (parser.extension_enabled (extensions::object_trailing_comma))
                                ? first_key_state
                                : key_state);
                        // Consume the comma and any whitespace before the close brace or property
                        // name.
                        return {this->make_whitespace_matcher (parser), true};
                    }
                    if (c == '}') {
                        this->end_object (parser);
                    } else {
                        this->set_error (parser, error_code::expected_object_member);
                    }
                    break;
                case done_state: PSTORE_ASSERT (false); break;
                }
                // No change of matcher. Consume the input character.
                return {nullptr, true};
            }